

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O3

void __thiscall Moc::parseSlots(Moc *this,ClassDef *def,Access access)

{
  Token TVar1;
  uint uVar2;
  bool bVar3;
  QTypeRevision QVar4;
  long lVar6;
  byte bVar7;
  long lVar8;
  long in_FS_OFFSET;
  FunctionDef local_108;
  long local_38;
  uint uVar5;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar6 = (this->super_Parser).symbols.d.size;
  lVar8 = (this->super_Parser).index;
  bVar7 = 0xff;
  if ((lVar8 < lVar6) && ((this->super_Parser).symbols.d.ptr[lVar8].token == Q_REVISION_TOKEN)) {
    (this->super_Parser).index = lVar8 + 1;
    QVar4 = parseRevision(this);
    uVar5 = (uint)(ushort)QVar4;
    bVar7 = QVar4.m_majorVersion;
    lVar6 = (this->super_Parser).symbols.d.size;
    lVar8 = (this->super_Parser).index;
  }
  else {
    uVar5 = 0xff;
  }
  if ((lVar6 <= lVar8) || ((this->super_Parser).symbols.d.ptr[lVar8].token != COLON)) {
    Parser::error(&this->super_Parser,(char *)0x0);
  }
  lVar6 = lVar8 + 1;
  (this->super_Parser).index = lVar6;
  if ((def->super_BaseDef).begin <= lVar8) {
    do {
      if (((def->super_BaseDef).end + -1 <= lVar6) || ((this->super_Parser).symbols.d.size <= lVar6)
         ) break;
      (this->super_Parser).index = lVar6 + 1;
      TVar1 = (this->super_Parser).symbols.d.ptr[lVar6].token;
      if ((int)TVar1 < 0x22) {
        if (TVar1 != SEMIC) goto LAB_0011bd17;
      }
      else {
        if ((int)TVar1 < 0x29) {
          if (TVar1 == FRIEND) {
            until(this,SEMIC);
            goto LAB_0011be22;
          }
        }
        else {
          if ((TVar1 - PRIVATE < 3) || (TVar1 - Q_SIGNALS_TOKEN < 2)) {
            (this->super_Parser).index = lVar6;
            break;
          }
          if (TVar1 == USING) {
            Parser::error(&this->super_Parser,
                          "\'using\' directive not supported in \'slots\' section");
          }
        }
LAB_0011bd17:
        (this->super_Parser).index = lVar6;
        local_108.type.name.d.d = (Data *)0x0;
        local_108.type.name.d.ptr = (char *)0x0;
        local_108.type.name.d.size = 0;
        local_108.type.rawName.d.d = (Data *)0x0;
        local_108.type.rawName.d.ptr = (char *)0x0;
        local_108.type.rawName.d.size = 0;
        local_108.type._48_4_ = 0xaaaaaaa8;
        local_108.type.typeTag.super_QFlagsStorageHelper<TypeTag,_4>.super_QFlagsStorage<TypeTag>.i
             = (QFlagsStorageHelper<TypeTag,_4>)0xaaaaaaaa;
        memset(&local_108.type.typeTag,0,0x9c);
        local_108.access = access;
        bVar3 = parseFunction(this,&local_108,false);
        if (bVar3) {
          uVar2 = local_108.revision;
          if ((0 < local_108.revision) ||
             (uVar2 = uVar5 & 0xff | (uint)bVar7 << 8, (bVar7 & (byte)uVar5) != 0xff)) {
            local_108.revision = uVar2;
            def->revisionedMethods = def->revisionedMethods + 1;
          }
          while( true ) {
            QtPrivate::QMovableArrayOps<FunctionDef>::emplace<FunctionDef_const&>
                      ((QMovableArrayOps<FunctionDef> *)&def->slotList,(def->slotList).d.size,
                       &local_108);
            QList<FunctionDef>::end(&def->slotList);
            if ((local_108.arguments.d.size == 0) ||
               (local_108.arguments.d.ptr[local_108.arguments.d.size + -1].isDefault != true))
            break;
            local_108.wasCloned = true;
            if ((local_108.arguments.d.d == (Data *)0x0) ||
               (1 < ((local_108.arguments.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i)) {
              QArrayDataPointer<ArgumentDef>::reallocateAndGrow
                        (&local_108.arguments.d,GrowsAtEnd,0,(QArrayDataPointer<ArgumentDef> *)0x0);
            }
            ArgumentDef::~ArgumentDef(local_108.arguments.d.ptr + local_108.arguments.d.size + -1);
            local_108.arguments.d.size = local_108.arguments.d.size + -1;
          }
        }
        FunctionDef::~FunctionDef(&local_108);
      }
LAB_0011be22:
      lVar6 = (this->super_Parser).index;
    } while ((def->super_BaseDef).begin < lVar6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Moc::parseSlots(ClassDef *def, FunctionDef::Access access)
{
    QTypeRevision defaultRevision;
    if (test(Q_REVISION_TOKEN))
        defaultRevision = parseRevision();

    next(COLON);
    while (inClass(def) && hasNext()) {
        switch (next()) {
        case PUBLIC:
        case PROTECTED:
        case PRIVATE:
        case Q_SIGNALS_TOKEN:
        case Q_SLOTS_TOKEN:
            prev();
            return;
        case SEMIC:
            continue;
        case FRIEND:
            until(SEMIC);
            continue;
        case USING:
            error("'using' directive not supported in 'slots' section");
        default:
            prev();
        }

        FunctionDef funcDef;
        funcDef.access = access;
        if (!parseFunction(&funcDef))
            continue;
        if (funcDef.revision > 0) {
            ++def->revisionedMethods;
        } else if (defaultRevision.isValid()) {
            funcDef.revision = defaultRevision.toEncodedVersion<int>();
            ++def->revisionedMethods;
        }
        def->slotList += funcDef;
        handleDefaultArguments(&def->slotList, funcDef);
    }
}